

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void TTD::RuntimeContextInfo::LoadAndOrderPropertyNames
               (RecyclableObject *obj,
               List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *propertyList)

{
  int index;
  bool bVar1;
  uint uVar2;
  uint propertyId;
  int iVar3;
  Type *ppPVar4;
  int index_00;
  uint uVar5;
  Type local_58;
  PropertyRecord *shiftElem;
  int local_48;
  Type local_44;
  ScriptContext *local_40;
  PropertyRecord *local_38;
  PropertyRecord *temp;
  
  if ((propertyList->
      super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).count
      != 0) {
    TTDAbort_unrecoverable_error("This should be empty.");
  }
  local_40 = (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  uVar2 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [10])();
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    propertyId = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[7])(obj,(ulong)(uVar5 & 0xffff));
    if (propertyId - 0x10 < 0xffffffef) {
      iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)propertyId);
      if (iVar3 == 0) {
        TTDAbort_unrecoverable_error("We are assuming this is own property count.");
      }
      local_38 = Js::ScriptContext::GetPropertyName(local_40,propertyId);
      JsUtil::
      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(propertyList,&local_38);
    }
  }
  local_44 = (propertyList->
             super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>)
             .count;
  shiftElem = (PropertyRecord *)0x0;
  do {
    if (shiftElem == (PropertyRecord *)0x6) {
      return;
    }
    index_00 = 0;
    iVar3 = (&DAT_00f24c70)[(long)shiftElem];
    for (local_48 = iVar3; local_48 < local_44; local_48 = local_48 + 1) {
      ppPVar4 = JsUtil::
                List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(propertyList,local_48);
      local_38 = *ppPVar4;
      local_40 = (ScriptContext *)CONCAT44(local_40._4_4_,index_00);
      for (; index = iVar3 + index_00, iVar3 <= index; index_00 = index_00 - iVar3) {
        ppPVar4 = JsUtil::
                  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(propertyList,index_00);
        bVar1 = PropertyNameCmp(*ppPVar4,local_38);
        if (!bVar1) break;
        ppPVar4 = JsUtil::
                  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(propertyList,index_00);
        local_58 = *ppPVar4;
        JsUtil::
        List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::SetItem(propertyList,index,&local_58);
      }
      JsUtil::
      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::SetItem(propertyList,index,&local_38);
      index_00 = (int)local_40 + 1;
    }
    shiftElem = (PropertyRecord *)
                ((long)&(shiftElem->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 1);
  } while( true );
}

Assistant:

void RuntimeContextInfo::LoadAndOrderPropertyNames(Js::RecyclableObject* obj, JsUtil::List<const Js::PropertyRecord*, HeapAllocator>& propertyList)
    {
        TTDAssert(propertyList.Count() == 0, "This should be empty.");

        Js::ScriptContext* ctx = obj->GetScriptContext();
        uint32 propcount = (uint32)obj->GetPropertyCount();

        //get all of the properties
        for(uint32 i = 0; i < propcount; ++i)
        {
            Js::PropertyIndex propertyIndex = (Js::PropertyIndex)i;
            Js::PropertyId propertyId = obj->GetPropertyId(propertyIndex);

            if((propertyId != Js::Constants::NoProperty) & (!Js::IsInternalPropertyId(propertyId)))
            {
                TTDAssert(obj->HasOwnProperty(propertyId), "We are assuming this is own property count.");

                propertyList.Add(ctx->GetPropertyName(propertyId));
            }
        }

        //now sort the list so the traversal order is stable
        //Rock a custom shell sort!!!!
        const int32 gaps[6] = { 132, 57, 23, 10, 4, 1 };

        int32 llen = propertyList.Count();
        for(uint32 gapi = 0; gapi < 6; ++gapi)
        {
            int32 gap = gaps[gapi];

            for(int32 i = gap; i < llen; i++)
            {
                const Js::PropertyRecord* temp = propertyList.Item(i);

                int32 j = 0;
                for(j = i; j >= gap && PropertyNameCmp(propertyList.Item(j - gap), temp); j -= gap)
                {
                    const Js::PropertyRecord* shiftElem = propertyList.Item(j - gap);
                    propertyList.SetItem(j, shiftElem);
                }

                propertyList.SetItem(j, temp);
            }
        }
    }